

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_encodeSequences_bmi2
                 (void *dst,size_t dstCapacity,FSE_CTable *CTable_MatchLength,BYTE *mlCodeTable,
                 FSE_CTable *CTable_OffsetBits,BYTE *ofCodeTable,FSE_CTable *CTable_LitLength,
                 BYTE *llCodeTable,seqDef *sequences,size_t nbSeq,int longOffsets)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  size_t sVar4;
  size_t sVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  BIT_CStream_t blockStream;
  FSE_CState_t stateLitLength;
  FSE_CState_t stateOffsetBits;
  FSE_CState_t stateMatchLength;
  
  blockStream.bitContainer = 0;
  blockStream.bitPos = 0;
  blockStream.endPtr = (char *)((long)dst + (dstCapacity - 8));
  if (dstCapacity < 9) {
    sVar5 = 0xffffffffffffffba;
  }
  else {
    blockStream.startPtr = (char *)dst;
    blockStream.ptr = (char *)dst;
    FSE_initCState2(&stateMatchLength,CTable_MatchLength,(uint)mlCodeTable[nbSeq - 1]);
    FSE_initCState2(&stateOffsetBits,CTable_OffsetBits,(uint)ofCodeTable[nbSeq - 1]);
    FSE_initCState2(&stateLitLength,CTable_LitLength,(uint)llCodeTable[nbSeq - 1]);
    BIT_addBits(&blockStream,(ulong)sequences[nbSeq - 1].litLength,LL_bits[llCodeTable[nbSeq - 1]]);
    BIT_addBits(&blockStream,(ulong)sequences[nbSeq - 1].matchLength,ML_bits[mlCodeTable[nbSeq - 1]]
               );
    if (longOffsets == 0) {
      uVar8 = sequences[nbSeq - 1].offset;
      uVar6 = (uint)ofCodeTable[nbSeq - 1];
    }
    else {
      uVar6 = (uint)ofCodeTable[nbSeq - 1];
      uVar8 = 0;
      uVar9 = (uint)ofCodeTable[nbSeq - 1];
      if ((0x37 < uVar9) && (uVar6 = 0x38, uVar8 = 0, uVar9 != 0x38)) {
        uVar8 = uVar9 - 0x38;
        BIT_addBits(&blockStream,(ulong)sequences[nbSeq - 1].offset,uVar8);
        BIT_flushBits(&blockStream);
      }
      uVar8 = sequences[nbSeq - 1].offset >> (uVar8 & 0x1f);
    }
    BIT_addBits(&blockStream,(ulong)uVar8,uVar6);
    BIT_flushBits(&blockStream);
    for (uVar10 = nbSeq - 2; uVar10 < nbSeq; uVar10 = uVar10 - 1) {
      bVar1 = llCodeTable[uVar10];
      bVar2 = ofCodeTable[uVar10];
      uVar9 = (uint)bVar2;
      bVar3 = mlCodeTable[uVar10];
      uVar8 = LL_bits[bVar1];
      uVar6 = ML_bits[bVar3];
      FSE_encodeSymbol(&blockStream,&stateOffsetBits,(uint)bVar2);
      FSE_encodeSymbol(&blockStream,&stateMatchLength,(uint)bVar3);
      FSE_encodeSymbol(&blockStream,&stateLitLength,(uint)bVar1);
      uVar7 = bVar2 + uVar8 + uVar6;
      if (0x1e < uVar7) {
        BIT_flushBits(&blockStream);
      }
      BIT_addBits(&blockStream,(ulong)sequences[uVar10].litLength,uVar8);
      BIT_addBits(&blockStream,(ulong)sequences[uVar10].matchLength,uVar6);
      if (0x38 < uVar7) {
        BIT_flushBits(&blockStream);
      }
      if (longOffsets == 0) {
        uVar8 = sequences[uVar10].offset;
      }
      else {
        uVar8 = 0;
        uVar9 = (uint)bVar2;
        if ((0x37 < bVar2) && (uVar8 = 0, uVar9 = 0x38, bVar2 != 0x38)) {
          uVar8 = bVar2 - 0x38;
          BIT_addBits(&blockStream,(ulong)sequences[uVar10].offset,uVar8);
          BIT_flushBits(&blockStream);
          uVar9 = 0x38;
        }
        uVar8 = sequences[uVar10].offset >> (uVar8 & 0x1f);
      }
      BIT_addBits(&blockStream,(ulong)uVar8,uVar9);
      BIT_flushBits(&blockStream);
    }
    FSE_flushCState(&blockStream,&stateMatchLength);
    FSE_flushCState(&blockStream,&stateOffsetBits);
    FSE_flushCState(&blockStream,&stateLitLength);
    sVar4 = BIT_closeCStream(&blockStream);
    sVar5 = 0xffffffffffffffba;
    if (sVar4 != 0) {
      sVar5 = sVar4;
    }
  }
  return sVar5;
}

Assistant:

MEM_STATIC size_t BIT_initCStream(BIT_CStream_t* bitC,
                                  void* startPtr, size_t dstCapacity)
{
    bitC->bitContainer = 0;
    bitC->bitPos = 0;
    bitC->startPtr = (char*)startPtr;
    bitC->ptr = bitC->startPtr;
    bitC->endPtr = bitC->startPtr + dstCapacity - sizeof(bitC->bitContainer);
    if (dstCapacity <= sizeof(bitC->bitContainer)) return ERROR(dstSize_tooSmall);
    return 0;
}